

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::delete_entry(CVmObjTable *this,vm_obj_id_t id,CVmObjPageEntry *entry)

{
  CVmObject *pCVar1;
  CVmObjPageEntry *pCVar2;
  CVmObjPageEntry *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjTable *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  vm_obj_id_t vVar3;
  
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xfffe | 1;
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xfffd;
  pCVar1 = CVmObjPageEntry::get_vm_obj(in_RDX);
  (*pCVar1->_vptr_CVmObject[2])(pCVar1,0);
  if ((*(ushort *)&in_RDX->field_0x14 >> 8 & 1) != 0) {
    remove_post_load_init
              ((CVmObjTable *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (vm_obj_id_t)((ulong)in_RDX >> 0x20));
  }
  in_RDX->next_obj_ = in_RDI->first_free_;
  vVar3 = in_ESI;
  if (in_RDI->first_free_ != 0) {
    pCVar2 = get_entry(in_RDI,in_RDI->first_free_);
    (pCVar2->ptr_).prev_free_ = in_ESI;
  }
  (in_RDX->ptr_).prev_free_ = 0;
  in_RDI->first_free_ = vVar3;
  return;
}

Assistant:

void CVmObjTable::delete_entry(VMG_ vm_obj_id_t id, CVmObjPageEntry *entry)
{
    /* mark the object table entry as free */
    entry->free_ = TRUE;

    /* it's not in the root set if it's free */
    entry->in_root_set_ = FALSE;

    /* 
     *   notify the object that it's being deleted - this will let the
     *   object release any additional resources (such as variable-size
     *   heap space) that it's holding 
     */
    entry->get_vm_obj()->notify_delete(vmg_ FALSE);

    /* 
     *   remove any post-load initialization request for the object, if it
     *   ever requested post-load initialization 
     */
    if (entry->requested_post_load_init_)
        remove_post_load_init(id);

    /* link this object into the head of the free list */
    entry->next_obj_ = first_free_;

    /* link the previous head back to this object */
    if (first_free_ != VM_INVALID_OBJ)
        get_entry(first_free_)->ptr_.prev_free_ = id;

    /* this object doesn't have a previous entry */
    entry->ptr_.prev_free_ = VM_INVALID_OBJ;
    
    /* it's now the first entry in the list */
    first_free_ = id;
}